

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldLiteGenerator::GenerateMembers
          (ImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &(this->super_ImmutableMessageFieldLiteGenerator).variables_;
  io::Printer::Print(printer,variables,"private com.google.protobuf.LazyFieldLite $name$_;");
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  text = 
  "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_message$;\n}\n"
  ;
  if (*(int *)(*(long *)((this->super_ImmutableMessageFieldLiteGenerator).descriptor_ + 0x30) + 0x8c
              ) == 3) {
    text = "$deprecation$public boolean has$capitalized_name$() {\n  return $name$_ != null;\n}\n";
  }
  io::Printer::Print(printer,variables,text);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($name$_ == null) {\n    return $type$.getDefaultInstance();\n  }\n  return ($type$) $name$_.getValue($type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  if ($name$_ == null) {\n    $name$_ = new com.google.protobuf.LazyFieldLite();\n  }\n  $name$_.setValue(value);\n  $set_has_field_bit_message$\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    $type$.Builder builderForValue) {\n  if ($name$_ == null) {\n    $name$_ = new com.google.protobuf.LazyFieldLite();\n  }\n  $name$_.setValue(builderForValue.build());\n  $set_has_field_bit_message$\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void merge$capitalized_name$($type$ value) {\n  if (has$capitalized_name$() &&\n      !$name$_.containsDefaultInstance()) {\n    $name$_.setValue(\n      $type$.newBuilder(\n          get$capitalized_name$()).mergeFrom(value).buildPartial());\n  } else {\n    if ($name$_ == null) {\n      $name$_ = new com.google.protobuf.LazyFieldLite();\n    }\n    $name$_.setValue(value);\n    $set_has_field_bit_message$\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $name$_ = null;\n  $clear_has_field_bit_message$;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.LazyFieldLite $name$_;");

  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_message$;\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $name$_ != null;\n"
      "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($name$_ == null) {\n"
    "    return $type$.getDefaultInstance();\n"
    "  }\n"
    "  return ($type$) $name$_.getValue($type$.getDefaultInstance());\n"
   "}\n");

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  if ($name$_ == null) {\n"
    "    $name$_ = new com.google.protobuf.LazyFieldLite();\n"
    "  }\n"
    "  $name$_.setValue(value);\n"
    "  $set_has_field_bit_message$\n"
    "}\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    $type$.Builder builderForValue) {\n"
    "  if ($name$_ == null) {\n"
    "    $name$_ = new com.google.protobuf.LazyFieldLite();\n"
    "  }\n"
    "  $name$_.setValue(builderForValue.build());\n"
    "  $set_has_field_bit_message$\n"
    "}\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void merge$capitalized_name$($type$ value) {\n"
    "  if (has$capitalized_name$() &&\n"
    "      !$name$_.containsDefaultInstance()) {\n"
    "    $name$_.setValue(\n"
    "      $type$.newBuilder(\n"
    "          get$capitalized_name$()).mergeFrom(value).buildPartial());\n"
    "  } else {\n"
    "    if ($name$_ == null) {\n"
    "      $name$_ = new com.google.protobuf.LazyFieldLite();\n"
    "    }\n"
    "    $name$_.setValue(value);\n"
    "    $set_has_field_bit_message$\n"
    "  }\n"
    "}\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $name$_ = null;\n"
    "  $clear_has_field_bit_message$;\n"
    "}\n");
}